

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O0

Num * __thiscall Num::multiplyByPowerOfTen(Num *__return_storage_ptr__,Num *this,Short length)

{
  Short SVar1;
  Short length_local;
  Num *this_local;
  Num *res;
  
  Num(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->base,(string *)&this->base);
  std::__cxx11::string::append((ulong)&__return_storage_ptr__->base,(char)length);
  SVar1 = getSize(__return_storage_ptr__);
  __return_storage_ptr__->size = SVar1;
  return __return_storage_ptr__;
}

Assistant:

Num Num::multiplyByPowerOfTen(Short length) const // function of multiplication a number by certain power of ten
{
    Num res;
    res.base = base;
    res.base.append(length, '0');
    res.size = res.getSize();
    return res;
}